

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int big2_contentTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  byte *pbVar6;
  char *pcVar7;
  undefined1 uVar8;
  byte *pbVar9;
  char cVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  byte bVar14;
  bool bVar15;
  
  if (end <= ptr) {
    return -4;
  }
  uVar11 = (long)end - (long)ptr & 0xfffffffffffffffe;
  pcVar4 = ptr + uVar11;
  if (uVar11 == 0) {
    pcVar4 = end;
  }
  bVar15 = ((long)end - (long)ptr & 1U) != 0;
  if (!bVar15) {
    pcVar4 = end;
  }
  if (bVar15 && uVar11 == 0) {
    return -1;
  }
  bVar1 = *ptr;
  if (bVar1 < 0xdc) {
    uVar8 = 7;
    if (3 < bVar1 - 0xd8) {
      if (bVar1 == 0) {
        uVar8 = *(undefined1 *)((long)enc[1].scanners + (ulong)(byte)ptr[1]);
      }
      else {
LAB_0055f580:
        uVar8 = 0x1d;
      }
    }
  }
  else if (bVar1 - 0xdc < 4) {
    uVar8 = 8;
  }
  else {
    if ((bVar1 != 0xff) || ((byte)ptr[1] < 0xfe)) goto LAB_0055f580;
    uVar8 = 0;
  }
  switch(uVar8) {
  case 0:
  case 1:
  case 8:
switchD_0055f59f_caseD_0:
    *nextTokPtr = ptr;
    return 0;
  case 2:
    pbVar9 = (byte *)(ptr + 2);
    lVar12 = (long)pcVar4 - (long)pbVar9;
    if (lVar12 < 2) {
      return -1;
    }
    bVar1 = *pbVar9;
    if (bVar1 < 0xdc) {
      cVar10 = '\a';
      if (3 < bVar1 - 0xd8) {
        if (bVar1 == 0) {
          cVar10 = *(char *)((long)enc[1].scanners + (ulong)(byte)ptr[3]);
        }
        else {
LAB_0055f82b:
          cVar10 = '\x1d';
        }
      }
    }
    else if (bVar1 - 0xdc < 4) {
      cVar10 = '\b';
    }
    else {
      if ((bVar1 != 0xff) || ((byte)ptr[3] < 0xfe)) goto LAB_0055f82b;
      cVar10 = '\0';
    }
    switch(cVar10) {
    case '\x05':
    case '\b':
    case '\t':
    case '\n':
    case '\v':
    case '\f':
    case '\r':
    case '\x0e':
    case '\x12':
    case '\x13':
    case '\x14':
    case '\x15':
    case '\x17':
      break;
    case '\a':
switchD_0055f84e_caseD_7:
      if (lVar12 < 4) {
        return -2;
      }
      break;
    case '\x0f':
      iVar3 = big2_scanPi(enc,ptr + 4,pcVar4,nextTokPtr);
      return iVar3;
    case '\x10':
      pbVar9 = (byte *)(ptr + 4);
      if ((long)pcVar4 - (long)pbVar9 < 2) {
        return -1;
      }
      bVar1 = *pbVar9;
      if (bVar1 < 0xdc) {
        cVar10 = '\a';
        if (3 < bVar1 - 0xd8) {
          if (bVar1 == 0) {
            cVar10 = *(char *)((long)enc[1].scanners + (ulong)(byte)ptr[5]);
          }
          else {
LAB_0055fd56:
            cVar10 = '\x1d';
          }
        }
      }
      else if (bVar1 - 0xdc < 4) {
        cVar10 = '\b';
      }
      else {
        if ((bVar1 != 0xff) || ((byte)ptr[5] < 0xfe)) goto LAB_0055fd56;
        cVar10 = '\0';
      }
      if (cVar10 == '\x14') {
        pcVar7 = ptr + 6;
        if ((long)pcVar4 - (long)pcVar7 < 0xc) {
          return -1;
        }
        lVar12 = 0;
        while ((*pcVar7 == '\0' && (pcVar7[1] == (&big2_scanCdataSection_CDATA_LSQB)[lVar12]))) {
          lVar12 = lVar12 + 1;
          pcVar7 = pcVar7 + 2;
          if (lVar12 == 6) {
            *nextTokPtr = ptr + 0x12;
            return 8;
          }
        }
LAB_0055fdc8:
        *nextTokPtr = pcVar7;
        return 0;
      }
      if (cVar10 == '\x1b') {
        iVar3 = big2_scanComment(enc,ptr + 6,pcVar4,nextTokPtr);
        return iVar3;
      }
      break;
    case '\x11':
      pbVar9 = (byte *)(ptr + 4);
      lVar12 = (long)pcVar4 - (long)pbVar9;
      if (lVar12 < 2) {
        return -1;
      }
      bVar1 = *pbVar9;
      if (bVar1 < 0xdc) {
        bVar14 = 7;
        if (3 < bVar1 - 0xd8) {
          if (bVar1 == 0) {
            bVar14 = *(byte *)((long)enc[1].scanners + (ulong)(byte)ptr[5]);
          }
          else {
LAB_0055fbb6:
            bVar14 = 0x1d;
          }
        }
      }
      else if (bVar1 - 0xdc < 4) {
        bVar14 = 8;
      }
      else {
        if ((bVar1 != 0xff) || ((byte)ptr[5] < 0xfe)) goto LAB_0055fbb6;
        bVar14 = 0;
      }
      if (0x15 < bVar14) {
        if (((bVar14 == 0x16) || (bVar14 == 0x18)) ||
           ((bVar14 == 0x1d &&
            ((*(uint *)((long)namingBitmap +
                       (ulong)((byte)ptr[5] >> 3 & 0x1c |
                              (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5)) >>
              ((byte)ptr[5] & 0x1f) & 1) != 0)))) {
          if ((long)(pcVar4 + (-6 - (long)ptr)) < 2) {
            return -1;
          }
          lVar13 = 7;
          lVar12 = 0;
LAB_0055fc82:
          bVar1 = ptr[lVar13 + -1];
          if (bVar1 < 0xdc) {
            uVar8 = 7;
            if (3 < bVar1 - 0xd8) {
              if (bVar1 == 0) {
                uVar8 = *(undefined1 *)((long)enc[1].scanners + (ulong)(byte)ptr[lVar13]);
              }
              else {
LAB_0055fcda:
                uVar8 = 0x1d;
              }
            }
          }
          else if (bVar1 - 0xdc < 4) {
            uVar8 = 8;
          }
          else {
            if ((bVar1 != 0xff) || ((byte)ptr[lVar13] < 0xfe)) goto LAB_0055fcda;
            uVar8 = 0;
          }
          switch(uVar8) {
          case 6:
            if (pcVar4 + (lVar12 - (long)ptr) == (char *)0x8) {
              return -2;
            }
            break;
          case 7:
            if ((long)(pcVar4 + (lVar12 - (long)ptr) + -6) < 4) {
              return -2;
            }
            break;
          case 9:
          case 10:
          case 0x15:
            pcVar4 = pcVar4 + (lVar12 - (long)ptr) + -8;
            if ((long)pcVar4 < 2) {
              return -1;
            }
            ptr = ptr + (8 - lVar12);
            goto LAB_0055fde8;
          case 0xb:
            pbVar6 = (byte *)(ptr + (8 - lVar12));
            goto LAB_0055ff29;
          case 0x16:
          case 0x18:
          case 0x19:
          case 0x1a:
          case 0x1b:
            goto switchD_0055fcf6_caseD_16;
          case 0x1d:
            if ((*(uint *)((long)namingBitmap +
                          (ulong)((byte)ptr[lVar13] >> 3 & 0x1c |
                                 (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5)) >>
                 ((byte)ptr[lVar13] & 0x1f) & 1) != 0) goto switchD_0055fcf6_caseD_16;
          }
          ptr = ptr + (6 - lVar12);
          goto switchD_0055f59f_caseD_0;
        }
        break;
      }
      if (bVar14 == 5) break;
      if (bVar14 != 6) {
        if (bVar14 != 7) break;
        goto switchD_0055f84e_caseD_7;
      }
    case '\x06':
      if (lVar12 == 2) {
        return -2;
      }
      break;
    case '\x16':
    case '\x18':
switchD_0055f84e_caseD_16:
      if ((long)(pcVar4 + (-4 - (long)ptr)) < 2) {
        return -1;
      }
      lVar12 = -4;
      pcVar7 = (char *)0x0;
LAB_0055f880:
      bVar1 = ptr[(long)(pcVar7 + 4)];
      if (bVar1 < 0xdc) {
        uVar8 = 7;
        if (3 < bVar1 - 0xd8) {
          if (bVar1 == 0) {
            uVar8 = *(undefined1 *)((long)enc[1].scanners + (ulong)(byte)ptr[(long)(pcVar7 + 5)]);
          }
          else {
LAB_0055f8da:
            uVar8 = 0x1d;
          }
        }
      }
      else if (bVar1 - 0xdc < 4) {
        uVar8 = 8;
      }
      else {
        if ((bVar1 != 0xff) || ((byte)ptr[(long)(pcVar7 + 5)] < 0xfe)) goto LAB_0055f8da;
        uVar8 = 0;
      }
      switch(uVar8) {
      case 6:
        if (pcVar4 + (-6 - (long)ptr) == pcVar7) {
          return -2;
        }
        break;
      case 7:
        if ((long)(pcVar4 + (lVar12 - (long)ptr)) < 4) {
          return -2;
        }
        break;
      case 9:
      case 10:
      case 0x15:
        if ((long)(pcVar4 + (-(long)pcVar7 - (long)ptr) + -6) < 2) {
          return -1;
        }
        pcVar5 = ptr + (long)(pcVar7 + 8);
        pcVar7 = pcVar4 + (-(long)pcVar7 - (long)ptr) + -8;
        goto LAB_0055fa8e;
      case 0xb:
        pcVar5 = ptr + (long)(pcVar7 + 4);
        goto LAB_0055fb1f;
      case 0x11:
        pcVar5 = ptr + (long)(pcVar7 + 4);
        goto LAB_0055fb6d;
      case 0x16:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
        goto switchD_0055f8f6_caseD_16;
      case 0x1d:
        if ((*(uint *)((long)namingBitmap +
                      (ulong)((byte)ptr[(long)(pcVar7 + 5)] >> 3 & 0x1c |
                             (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5)) >>
             ((byte)ptr[(long)(pcVar7 + 5)] & 0x1f) & 1) == 0) break;
        goto switchD_0055f8f6_caseD_16;
      }
      *nextTokPtr = ptr + (long)(pcVar7 + 4);
      return 0;
    default:
      if ((cVar10 == '\x1d') &&
         ((*(uint *)((long)namingBitmap +
                    (ulong)((byte)ptr[3] >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5)
                    ) >> ((byte)ptr[3] & 0x1f) & 1) != 0)) goto switchD_0055f84e_caseD_16;
    }
    goto switchD_0055f84e_caseD_5;
  case 3:
    iVar3 = big2_scanRef(enc,ptr + 2,pcVar4,nextTokPtr);
    return iVar3;
  case 4:
    pbVar6 = (byte *)(ptr + 2);
    if ((long)pcVar4 - (long)pbVar6 < 2) {
      return -5;
    }
    if ((*pbVar6 == 0) && (ptr[3] == ']')) {
      pcVar7 = ptr + 4;
      if ((long)pcVar4 - (long)pcVar7 < 2) {
        return -5;
      }
      if ((*pcVar7 == '\0') && (ptr[5] == '>')) {
        *nextTokPtr = pcVar7;
        return 0;
      }
    }
    break;
  case 5:
    if ((long)pcVar4 - (long)ptr < 2) {
      return -2;
    }
  default:
    pbVar6 = (byte *)(ptr + 2);
    break;
  case 6:
    if ((long)pcVar4 - (long)ptr < 3) {
      return -2;
    }
    pbVar6 = (byte *)(ptr + 3);
    break;
  case 7:
    if ((long)pcVar4 - (long)ptr < 4) {
      return -2;
    }
    pbVar6 = (byte *)(ptr + 4);
    break;
  case 9:
    pcVar7 = ptr + 2;
    if (1 < (long)pcVar4 - (long)pcVar7) {
      if (*pcVar7 == '\0') {
        bVar15 = *(char *)((long)enc[1].scanners + (ulong)(byte)ptr[3]) == '\n';
      }
      else {
        bVar15 = false;
      }
      if (bVar15) {
        pcVar7 = ptr + 4;
      }
      *nextTokPtr = pcVar7;
      return 7;
    }
    return -3;
  case 10:
    *nextTokPtr = ptr + 2;
    return 7;
  }
joined_r0x0055f68b:
  pbVar9 = pbVar6;
  lVar12 = (long)pcVar4 - (long)pbVar9;
  if (lVar12 < 2) {
    *nextTokPtr = (char *)pbVar9;
    return 6;
  }
  bVar1 = *pbVar9;
  if (bVar1 < 0xdc) {
    uVar8 = 7;
    if (3 < bVar1 - 0xd8) {
      if (bVar1 == 0) {
        uVar8 = *(undefined1 *)((long)enc[1].scanners + (ulong)pbVar9[1]);
      }
      else {
LAB_0055f6f0:
        uVar8 = 0x1d;
      }
    }
  }
  else if (bVar1 - 0xdc < 4) {
    uVar8 = 8;
  }
  else {
    if ((bVar1 != 0xff) || (pbVar9[1] < 0xfe)) goto LAB_0055f6f0;
    uVar8 = 0;
  }
  switch(uVar8) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 8:
  case 9:
  case 10:
    break;
  case 4:
    if (lVar12 < 4) break;
    pbVar6 = pbVar9 + 2;
    if ((pbVar9[2] != 0) || (pbVar9[3] != 0x5d)) goto joined_r0x0055f68b;
    if (lVar12 < 6) break;
    if ((pbVar9[4] != 0) || (pbVar9[5] != 0x3e)) goto joined_r0x0055f68b;
    pbVar9 = pbVar9 + 4;
switchD_0055f84e_caseD_5:
    *nextTokPtr = (char *)pbVar9;
    return 0;
  default:
    pbVar6 = pbVar9 + 2;
    goto joined_r0x0055f68b;
  case 6:
    if (lVar12 != 2) {
      pbVar6 = pbVar9 + 3;
      goto joined_r0x0055f68b;
    }
    break;
  case 7:
    if (3 < lVar12) {
      pbVar6 = pbVar9 + 4;
      goto joined_r0x0055f68b;
    }
  }
  *nextTokPtr = (char *)pbVar9;
  return 6;
switchD_0055f8f6_caseD_16:
  pcVar7 = pcVar7 + 2;
  lVar13 = lVar12 - (long)ptr;
  lVar12 = lVar12 + -2;
  if ((long)(pcVar4 + lVar13 + -2) < 2) {
    return -1;
  }
  goto LAB_0055f880;
LAB_0055fa8e:
  bVar1 = pcVar5[-2];
  if (bVar1 < 0xdc) {
    uVar8 = 7;
    if (3 < bVar1 - 0xd8) {
      if (bVar1 == 0) {
        uVar8 = *(undefined1 *)((long)enc[1].scanners + (ulong)(byte)pcVar5[-1]);
      }
      else {
LAB_0055fadf:
        uVar8 = 0x1d;
      }
    }
  }
  else if (bVar1 - 0xdc < 4) {
    uVar8 = 8;
  }
  else {
    if ((bVar1 != 0xff) || ((byte)pcVar5[-1] < 0xfe)) goto LAB_0055fadf;
    uVar8 = 0;
  }
  switch(uVar8) {
  case 6:
    if (pcVar7 == (char *)0x0) {
      return -2;
    }
    break;
  case 7:
    if (pcVar7 + 2 < (char *)0x4) {
      return -2;
    }
    break;
  case 9:
  case 10:
  case 0x15:
    goto switchD_0055faf7_caseD_9;
  case 0xb:
    pcVar5 = pcVar5 + -2;
LAB_0055fb1f:
    *nextTokPtr = pcVar5 + 2;
    return 2;
  case 0x11:
    pcVar5 = pcVar5 + -2;
LAB_0055fb6d:
    pcVar7 = pcVar5 + 2;
    if ((long)pcVar4 - (long)pcVar7 < 2) {
      return -1;
    }
    if ((*pcVar7 == '\0') && (pcVar5[3] == '>')) {
      *nextTokPtr = pcVar5 + 4;
      return 4;
    }
    goto LAB_0055fdc8;
  case 0x16:
  case 0x18:
switchD_0055faf7_caseD_16:
    iVar3 = big2_scanAtts(enc,pcVar5,pcVar4,nextTokPtr);
    return iVar3;
  case 0x1d:
    if ((*(uint *)((long)namingBitmap +
                  (ulong)((byte)pcVar5[-1] >> 3 & 0x1c |
                         (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5)) >> ((byte)pcVar5[-1] & 0x1f)
        & 1) != 0) goto switchD_0055faf7_caseD_16;
  }
  ptr = pcVar5 + -2;
  goto switchD_0055f59f_caseD_0;
switchD_0055faf7_caseD_9:
  pcVar5 = pcVar5 + 2;
  bVar15 = (long)pcVar7 < 2;
  pcVar7 = pcVar7 + -2;
  if (bVar15) {
    return -1;
  }
  goto LAB_0055fa8e;
switchD_0055fcf6_caseD_16:
  lVar2 = lVar12 - (long)ptr;
  lVar12 = lVar12 + -2;
  lVar13 = lVar13 + 2;
  if ((long)(pcVar4 + lVar2 + -8) < 2) {
    return -1;
  }
  goto LAB_0055fc82;
LAB_0055fde8:
  bVar1 = *ptr;
  if (bVar1 < 0xdc) {
    bVar14 = 7;
    if (3 < bVar1 - 0xd8) {
      if (bVar1 == 0) {
        bVar14 = *(byte *)((long)enc[1].scanners + (ulong)((byte *)ptr)[1]);
      }
      else {
LAB_0055fe3f:
        bVar14 = 0x1d;
      }
    }
  }
  else if (bVar1 - 0xdc < 4) {
    bVar14 = 8;
  }
  else {
    if ((bVar1 != 0xff) || (((byte *)ptr)[1] < 0xfe)) goto LAB_0055fe3f;
    bVar14 = 0;
  }
  if ((1 < bVar14 - 9) && (bVar14 != 0x15)) {
    if (bVar14 == 0xb) {
      pbVar6 = (byte *)ptr + 2;
LAB_0055ff29:
      *nextTokPtr = (char *)pbVar6;
      return 5;
    }
    goto switchD_0055f59f_caseD_0;
  }
  ptr = (char *)((byte *)ptr + 2);
  pcVar4 = pcVar4 + -2;
  if ((long)pcVar4 < 2) {
    return -1;
  }
  goto LAB_0055fde8;
}

Assistant:

static int PTRCALL
PREFIX(contentTok)(const ENCODING *enc, const char *ptr, const char *end,
                   const char **nextTokPtr)
{
  if (ptr >= end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_LT:
    return PREFIX(scanLt)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_AMP:
    return PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_CR:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return XML_TOK_TRAILING_CR;
    if (BYTE_TYPE(enc, ptr) == BT_LF)
      ptr += MINBPC(enc);
    *nextTokPtr = ptr;
    return XML_TOK_DATA_NEWLINE;
  case BT_LF:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DATA_NEWLINE;
  case BT_RSQB:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return XML_TOK_TRAILING_RSQB;
    if (!CHAR_MATCHES(enc, ptr, ASCII_RSQB))
      break;
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return XML_TOK_TRAILING_RSQB;
    if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
      ptr -= MINBPC(enc);
      break;
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  INVALID_CASES(ptr, nextTokPtr)
  default:
    ptr += MINBPC(enc);
    break;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
#define LEAD_CASE(n) \
    case BT_LEAD ## n: \
      if (end - ptr < n || IS_INVALID_CHAR(enc, ptr, n)) { \
        *nextTokPtr = ptr; \
        return XML_TOK_DATA_CHARS; \
      } \
      ptr += n; \
      break;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
    case BT_RSQB:
      if (HAS_CHARS(enc, ptr, end, 2)) {
         if (!CHAR_MATCHES(enc, ptr + MINBPC(enc), ASCII_RSQB)) {
           ptr += MINBPC(enc);
           break;
         }
         if (HAS_CHARS(enc, ptr, end, 3)) {
           if (!CHAR_MATCHES(enc, ptr + 2*MINBPC(enc), ASCII_GT)) {
             ptr += MINBPC(enc);
             break;
           }
           *nextTokPtr = ptr + 2*MINBPC(enc);
           return XML_TOK_INVALID;
         }
      }
      /* fall through */
    case BT_AMP:
    case BT_LT:
    case BT_NONXML:
    case BT_MALFORM:
    case BT_TRAIL:
    case BT_CR:
    case BT_LF:
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  *nextTokPtr = ptr;
  return XML_TOK_DATA_CHARS;
}